

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

GetElementPtrInst *
GetElementPtrInst::create_gep
          (Value *ptr,vector<Value_*,_std::allocator<Value_*>_> *idxs,BasicBlock *bb)

{
  GetElementPtrInst *this;
  _Vector_base<Value_*,_std::allocator<Value_*>_> _Stack_38;
  
  this = (GetElementPtrInst *)operator_new(0x90);
  std::vector<Value_*,_std::allocator<Value_*>_>::vector
            ((vector<Value_*,_std::allocator<Value_*>_> *)&_Stack_38,idxs);
  GetElementPtrInst(this,ptr,(vector<Value_*,_std::allocator<Value_*>_> *)&_Stack_38,bb);
  std::_Vector_base<Value_*,_std::allocator<Value_*>_>::~_Vector_base(&_Stack_38);
  return this;
}

Assistant:

GetElementPtrInst *GetElementPtrInst::create_gep(Value *ptr, std::vector<Value *> idxs, BasicBlock *bb)
{
    return new GetElementPtrInst(ptr, idxs, bb);
}